

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void CM_init_select(CMControlList cl,CManager_conflict cm)

{
  int iVar1;
  __pid_t _Var2;
  char *__dest;
  void *pvVar3;
  pthread_t pVar4;
  long lVar5;
  pthread_t pVar6;
  undefined8 *puVar7;
  long in_RSI;
  long *in_RDI;
  void **data;
  timespec ts_3;
  timespec ts_2;
  timespec ts_1;
  pthread_t server_thread;
  void *handle;
  char *libname;
  timespec ts;
  char *select_module;
  _select_item sel_item;
  void *dlhandle;
  SelectInitFunc select_free_function;
  SelectInitFunc shutdown_function;
  SelectInitFunc init_function;
  int in_stack_fffffffffffffebc;
  FILE *in_stack_fffffffffffffec0;
  CMPollFunc in_stack_fffffffffffffec8;
  CManager_conflict in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  void *in_stack_fffffffffffffee0;
  FILE *pFVar8;
  undefined8 in_stack_fffffffffffffef8;
  CMTraceType trace_type;
  CManager in_stack_ffffffffffffff00;
  timespec local_f8;
  undefined4 local_e8;
  int in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  long local_d0;
  timespec local_b0;
  char *local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  code *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  code *local_18;
  long local_10;
  long *local_8;
  
  trace_type = (CMTraceType)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_30 = (void *)0x0;
  local_a0 = *(char **)(in_RSI + 0x10);
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RSI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffff00,trace_type);
    if (iVar1 == 0) goto LAB_0011775e;
  }
  else if (CMtrace_val[1] == 0) goto LAB_0011775e;
  if (CMtrace_PID != 0) {
    pFVar8 = *(FILE **)(local_10 + 0x120);
    _Var2 = getpid();
    lVar5 = (long)_Var2;
    pVar6 = pthread_self();
    fprintf(pFVar8,"P%lxT%lx - ",lVar5,pVar6);
    trace_type = (CMTraceType)((ulong)lVar5 >> 0x20);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_b0);
    fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_b0.tv_sec,local_b0.tv_nsec);
  }
  fprintf(*(FILE **)(local_10 + 0x120),"Loading CMselect module %s\n",local_a0);
LAB_0011775e:
  fflush(*(FILE **)(local_10 + 0x120));
  CMdladdsearchdir((char *)in_stack_fffffffffffffec0);
  CMdladdsearchdir((char *)in_stack_fffffffffffffec0);
  strlen(local_a0);
  __dest = (char *)INT_CMmalloc((size_t)in_stack_fffffffffffffec0);
  strcpy(__dest,"libadios2_cm");
  strcat(__dest,local_a0);
  strcat(__dest,".so");
  pvVar3 = CMdlopen(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  local_30 = pvVar3;
  free(__dest);
  if (pvVar3 == (void *)0x0) {
    fprintf(_stderr,"Failed to load requested libcm%s dll.\n",local_a0);
    fprintf(_stderr,
            "Search path includes \'.\', \'%s\', \'%s\' and any default search paths supported by ld.so\n"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O0/thirdparty/EVPath/EVPath/lib/adios2-evpath-modules-2_10"
            ,"/usr/local/lib/adios2-evpath-modules-2_10");
    fprintf(_stderr,"Consider setting LD_LIBRARY_PATH or otherwise modifying module search paths.\n"
           );
    exit(1);
  }
  local_98 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_90 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_88 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_80 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_78 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_70 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_68 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_60 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_58 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_50 = (code *)CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_48 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_40 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_38 = CMdlsym(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_8[0xc] = (long)local_98;
  local_8[0xd] = (long)local_90;
  local_8[0xe] = (long)local_88;
  local_8[0xf] = (long)local_80;
  local_8[0x10] = (long)local_78;
  local_8[0x11] = (long)local_70;
  local_8[0x13] = (long)local_68;
  *local_8 = (long)local_60;
  local_8[4] = (long)local_58;
  local_18 = local_50;
  local_20 = local_48;
  local_28 = local_40;
  local_8[0x12] = (long)local_38;
  local_8[2] = (long)(local_8 + 0xb);
  local_8[1] = 0;
  local_8[6] = (long)(local_8 + 0xb);
  local_8[5] = 0;
  if ((((local_8[0xc] != 0) && (local_8[0xd] != 0)) && (*local_8 != 0)) &&
     ((local_8[0xf] != 0 && (local_8[0x11] != 0)))) {
    (*local_50)(&CMstatic_trans_svcs,local_10,*(long *)(local_10 + 0x20) + 0x58);
    if ((int)local_8[0x1d] == -1) {
      pVar4 = thr_fork((_func_void_ptr_void_ptr *)in_stack_fffffffffffffec8,
                       in_stack_fffffffffffffec0);
      if (pVar4 == 0) {
        return;
      }
      iVar1 = CMtrace_val[3];
      if (*(long *)(local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffff00,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar8 = *(FILE **)(local_10 + 0x120);
          _Var2 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar8,"P%lxT%lx - ",(long)_Var2,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&stack0xffffffffffffff28);
          fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffff28,local_d0);
        }
        fprintf(*(FILE **)(local_10 + 0x120),"CM - Forked comm thread %p\n",pVar4);
      }
      fflush(*(FILE **)(local_10 + 0x120));
      *(pthread_t *)(*(long *)(local_10 + 0x20) + 0xf0) = pVar4;
      *(int *)(*(long *)(local_10 + 0x20) + 0xa0) = *(int *)(*(long *)(local_10 + 0x20) + 0xa0) + 1;
      *(int *)(*(long *)(local_10 + 0x20) + 0xa4) = *(int *)(*(long *)(local_10 + 0x20) + 0xa4) + 1;
      *(undefined4 *)(local_8 + 0x1d) = 1;
      *(int *)(local_10 + 0xc) = *(int *)(local_10 + 0xc) + 1;
      iVar1 = CMtrace_val[7];
      if (*(long *)(local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffff00,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          in_stack_fffffffffffffed0 = *(CManager_conflict *)(local_10 + 0x120);
          _Var2 = getpid();
          lVar5 = (long)_Var2;
          pVar6 = pthread_self();
          fprintf((FILE *)in_stack_fffffffffffffed0,"P%lxT%lx - ",lVar5,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&local_e8);
          fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",
                  CONCAT44(in_stack_ffffffffffffff1c,local_e8),in_stack_ffffffffffffff20);
        }
        fprintf(*(FILE **)(local_10 + 0x120),"Forked - CManager %p ref count now %d\n",local_10,
                (ulong)*(uint *)(local_10 + 0xc));
      }
      fflush(*(FILE **)(local_10 + 0x120));
    }
    *(undefined4 *)(local_8 + 10) = 1;
    iVar1 = CMtrace_val[7];
    if (*(long *)(local_10 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffff00,trace_type);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_fffffffffffffec0 = *(FILE **)(local_10 + 0x120);
        _Var2 = getpid();
        in_stack_fffffffffffffec8 = (CMPollFunc)(long)_Var2;
        pVar6 = pthread_self();
        fprintf(in_stack_fffffffffffffec0,"P%lxT%lx - ",in_stack_fffffffffffffec8,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_f8);
        fprintf(*(FILE **)(local_10 + 0x120),"%lld.%.9ld - ",local_f8.tv_sec,local_f8.tv_nsec);
      }
      fprintf(*(FILE **)(local_10 + 0x120),"CManager adding select shutdown function, %p\n",local_20
             );
    }
    fflush(*(FILE **)(local_10 + 0x120));
    internal_add_shutdown_task
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffebc);
    puVar7 = (undefined8 *)INT_CMmalloc((size_t)in_stack_fffffffffffffec0);
    *puVar7 = local_28;
    puVar7[1] = *(undefined8 *)(*(long *)(local_10 + 0x20) + 0x58);
    puVar7[2] = local_30;
    internal_add_shutdown_task
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffebc);
    return;
  }
  printf("Select failed to load properly\n");
  exit(1);
}

Assistant:

static void
CM_init_select(CMControlList cl, CManager cm)
{
    SelectInitFunc init_function;
    SelectInitFunc shutdown_function;
    SelectInitFunc select_free_function;
    void *dlhandle = NULL;
    struct _select_item sel_item;
    char *select_module = cm->control_module_choice;
     
    CMtrace_out(cm, CMControlVerbose, "Loading CMselect module %s\n", select_module);
#if !NO_DYNAMIC_LINKING
    char *libname;
    lt_dlhandle handle;	
    lt_dladdsearchdir(EVPATH_MODULE_BUILD_DIR);
    lt_dladdsearchdir(EVPATH_MODULE_INSTALL_DIR);
    libname = malloc(strlen("lib" CM_LIBRARY_PREFIX "cm") + strlen(select_module) + strlen(MODULE_EXT) + 1);
#ifndef HAVE_WINDOWS_H
    strcpy(libname, "lib" CM_LIBRARY_PREFIX "cm");
#else
    strcpy(libname, CM_LIBRARY_PREFIX "cm");
#endif
    strcat(libname, select_module);
    strcat(libname, MODULE_EXT);
    handle = CMdlopen(cm->CMTrace_file, libname, 0);
    dlhandle = handle;
    free(libname);
    if (!handle) {
	fprintf(stderr, "Failed to load requested libcm%s dll.\n", select_module);
	fprintf(stderr, "Search path includes '.', '%s', '%s' and any default search paths supported by ld.so\n", EVPATH_MODULE_BUILD_DIR, 
		EVPATH_MODULE_INSTALL_DIR);
	fprintf(stderr, "Consider setting LD_LIBRARY_PATH or otherwise modifying module search paths.\n");
	exit(1);
    }
    sel_item.add_select = (CMAddSelectFunc)lt_dlsym(handle, "add_select");  
    sel_item.remove_select = (CMRemoveSelectFunc)lt_dlsym(handle, "remove_select");  
    sel_item.write_select = (CMAddSelectFunc)lt_dlsym(handle, "write_select");  
    sel_item.add_periodic = (CMAddPeriodicFunc)lt_dlsym(handle, "add_periodic");  
    sel_item.add_delayed_task = 
	(CMAddPeriodicFunc)lt_dlsym(handle, "add_delayed_task");  
    sel_item.remove_periodic = (CMRemovePeriodicFunc)lt_dlsym(handle, "remove_periodic");  
    sel_item.wake_function = (CMWakeSelectFunc)lt_dlsym(handle, "wake_function");
    sel_item.blocking_function = (CMPollFunc)lt_dlsym(handle, "blocking_function");
    sel_item.polling_function = (CMPollFunc)lt_dlsym(handle, "polling_function");;
    sel_item.initialize = (SelectInitFunc)lt_dlsym(handle, "select_initialize");
    sel_item.shutdown = (SelectInitFunc)lt_dlsym(handle, "select_shutdown");
    sel_item.free = (SelectInitFunc)lt_dlsym(handle, "select_free");
    sel_item.stop = (CMWakeSelectFunc)lt_dlsym(handle, "select_stop");
#else

#ifdef HAVE_SYS_EPOLL_H
    if (strcmp(select_module, "epoll") == 0) {
	libcmepoll_init_sel_item(&sel_item);
    }
#endif
    if (strcmp(select_module, "select") == 0) {
	libcmselect_init_sel_item(&sel_item);
    }

#endif
     cl->add_select = sel_item.add_select;
     cl->remove_select = sel_item.remove_select;
     cl->write_select = sel_item.write_select;
     cl->add_periodic = sel_item.add_periodic;
     cl->add_delayed_task = sel_item.add_delayed_task;
     cl->remove_periodic = sel_item.remove_periodic;
     cl->wake_select = sel_item.wake_function;
     cl->network_blocking_function.func = sel_item.blocking_function;
     cl->network_polling_function.func = sel_item.polling_function;
     init_function = sel_item.initialize;
     shutdown_function = sel_item.shutdown;
     select_free_function = sel_item.free;
     cl->stop_select = sel_item.stop;

    cl->network_blocking_function.client_data = (void*)&(cl->select_data);
    cl->network_blocking_function.cm = NULL;
    cl->network_polling_function.client_data = (void*)&(cl->select_data);
    cl->network_polling_function.cm = NULL;
     if ((cl->add_select == NULL) || (cl->remove_select == NULL) || 
	 (cl->network_blocking_function.func == NULL) || (cl->add_periodic == NULL) ||
	 (cl->remove_periodic == NULL)) {
	 printf("Select failed to load properly\n");
	 exit(1);
     }
     init_function(&CMstatic_trans_svcs, cm, &cm->control_list->select_data);
    if (cl->has_thread == -1) {
	thr_thread_t server_thread = 
	    thr_fork((void*(*)(void*))server_thread_func, 
		     (void*)cm);
	if (server_thread ==  (thr_thread_t) (intptr_t)NULL) {
	    return;
	}
	CMtrace_out(cm, CMLowLevelVerbose,
		    "CM - Forked comm thread %p\n", (void*)(intptr_t)server_thread);
	cm->control_list->server_thread = thr_get_thread_id(server_thread);
	cm->control_list->cl_reference_count++;
	cm->control_list->free_reference_count++;
	cl->has_thread = 1;
	cm->reference_count++;
	CMtrace_out(cm, CMFreeVerbose, "Forked - CManager %p ref count now %d\n", 
		    cm, cm->reference_count);
    }
     cl->select_initialized = 1;
     CMtrace_out(cm, CMFreeVerbose, "CManager adding select shutdown function, %p\n",shutdown_function);
     internal_add_shutdown_task(cm, select_shutdown, (void*)shutdown_function, SHUTDOWN_TASK);
     {
	 void ** data = malloc(3 * sizeof(void*));
	 data[0] = select_free_function;
	 data[1] = cm->control_list->select_data;
	 data[2] = dlhandle;
	 internal_add_shutdown_task(cm, select_free, (void*)data, FREE_TASK);
     }
 }